

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *field,Reader *replacement)

{
  uint uVar1;
  uint uVar2;
  WirePointer *pWVar3;
  WirePointer *pWVar4;
  ushort uVar5;
  short sVar6;
  long lVar7;
  CapTableReader *pCVar8;
  CapTableReader *pCVar9;
  ushort uVar10;
  int iVar11;
  long lVar12;
  SegmentReader *pSVar13;
  uint64_t uVar14;
  SegmentReader *pSVar15;
  int iVar16;
  bool bVar17;
  Fault f;
  anon_class_8_1_a7e8901a _kjContextFunc798;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:798:5)>
  _kjContext798;
  StructReader local_200;
  void *local_1d0;
  void *local_1c8;
  CapTableReader *local_1c0;
  StructReader local_1b8;
  Reader *local_188;
  PointerReader local_180;
  Context local_160;
  Reader **local_118;
  Maybe<capnp::schema::Field::Reader> local_110;
  Maybe<capnp::schema::Node::Reader> local_d8;
  Maybe<capnp::schema::Field::Reader> local_a0;
  Maybe<capnp::schema::Node::Reader> local_68;
  
  local_188 = field;
  kj::_::Debug::Context::Context(&local_160);
  local_160.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)&PTR__Context_0064a0f8;
  uVar1 = (field->_reader).dataSize;
  uVar5 = 0;
  uVar10 = 0;
  if (0x1f < uVar1) {
    bVar17 = *(short *)((long)(field->_reader).data + 2) == 0;
    uVar10 = 0xffff;
    if (bVar17) {
      uVar10 = 0;
    }
    if (!bVar17 && 0x1f < uVar1) {
      uVar10 = *(ushort *)((long)(field->_reader).data + 2) ^ 0xffff;
    }
  }
  uVar2 = (replacement->_reader).dataSize;
  if (0x1f < uVar2) {
    bVar17 = *(short *)((long)(replacement->_reader).data + 2) == 0;
    uVar5 = 0xffff;
    if (bVar17) {
      uVar5 = 0;
    }
    if (!bVar17 && 0x1f < uVar2) {
      uVar5 = *(ushort *)((long)(replacement->_reader).data + 2) ^ 0xffff;
    }
  }
  local_118 = &local_188;
  if (uVar10 == uVar5) {
    if (uVar1 < 0x50) {
      sVar6 = 0;
    }
    else {
      sVar6 = *(short *)((long)(field->_reader).data + 8);
    }
    if (sVar6 == 1) {
      if (uVar2 < 0x50) {
        sVar6 = 0;
      }
      else {
        sVar6 = *(short *)((long)(replacement->_reader).data + 8);
      }
      if (sVar6 == 1) {
        if (uVar1 < 0xc0) {
          lVar7 = 0;
        }
        else {
          lVar7 = *(long *)((long)(field->_reader).data + 0x10);
        }
        if (uVar2 < 0xc0) {
          lVar12 = 0;
        }
        else {
          lVar12 = *(long *)((long)(replacement->_reader).data + 0x10);
        }
        if (lVar7 != lVar12) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[17]>
                    ((Fault *)&local_200,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x349,FAILED,
                     "field.getGroup().getTypeId() == replacement.getGroup().getTypeId()",
                     "\"group id changed\"",(char (*) [17])"group id changed");
          this->compatibility = INCOMPATIBLE;
          kj::_::Debug::Fault::~Fault((Fault *)&local_200);
        }
      }
      else if (sVar6 == 0) {
        if ((replacement->_reader).pointerCount < 3) {
          local_1b8.pointers._0_4_ = 0x7fffffff;
          local_1b8.capTable = (CapTableReader *)0x0;
          local_1b8.data = (WirePointer *)0x0;
          local_1b8.segment = (SegmentReader *)0x0;
        }
        else {
          local_1b8.pointers._0_4_ = (replacement->_reader).nestingLimit;
          local_1b8.segment = (replacement->_reader).segment;
          local_1b8.capTable = (replacement->_reader).capTable;
          local_1b8.data = (replacement->_reader).pointers + 2;
        }
        capnp::_::PointerReader::getStruct(&local_200,(PointerReader *)&local_1b8,(word *)0x0);
        if ((field->_reader).dataSize < 0xc0) {
          uVar14 = 0;
        }
        else {
          uVar14 = *(uint64_t *)((long)(field->_reader).data + 0x10);
        }
        local_d8.ptr.isSet = true;
        local_d8.ptr.field_1.value._reader.segment = (this->replacementNode)._reader.segment;
        local_d8.ptr.field_1.value._reader.capTable = (this->replacementNode)._reader.capTable;
        local_d8.ptr.field_1.value._reader.data = (this->replacementNode)._reader.data;
        local_d8.ptr.field_1.value._reader.pointers = (this->replacementNode)._reader.pointers;
        local_d8.ptr.field_1._32_4_ = (this->replacementNode)._reader.dataSize;
        local_d8.ptr.field_1._36_2_ = (this->replacementNode)._reader.pointerCount;
        local_d8.ptr.field_1._38_2_ = *(undefined2 *)&(this->replacementNode)._reader.field_0x26;
        local_d8.ptr.field_1._40_8_ = *(undefined8 *)&(this->replacementNode)._reader.nestingLimit;
        local_110.ptr.isSet = true;
        local_110.ptr.field_1.value._reader.segment = (replacement->_reader).segment;
        local_110.ptr.field_1.value._reader.capTable = (replacement->_reader).capTable;
        local_110.ptr.field_1.value._reader.data = (replacement->_reader).data;
        local_110.ptr.field_1.value._reader.pointers = (replacement->_reader).pointers;
        local_110.ptr.field_1._32_4_ = (replacement->_reader).dataSize;
        local_110.ptr.field_1._36_2_ = (replacement->_reader).pointerCount;
        local_110.ptr.field_1._38_2_ = *(undefined2 *)&(replacement->_reader).field_0x26;
        local_110.ptr.field_1._40_8_ = *(undefined8 *)&(replacement->_reader).nestingLimit;
        checkUpgradeToStruct(this,(Reader *)&local_200,uVar14,&local_d8,&local_110);
      }
    }
    else if (sVar6 == 0) {
      if (uVar2 < 0x50) {
        sVar6 = 0;
      }
      else {
        sVar6 = *(short *)((long)(replacement->_reader).data + 8);
      }
      pSVar15 = (field->_reader).segment;
      pCVar8 = (field->_reader).capTable;
      pWVar3 = (field->_reader).pointers;
      uVar10 = (field->_reader).pointerCount;
      iVar11 = (field->_reader).nestingLimit;
      if (sVar6 == 1) {
        if (uVar10 < 3) {
          iVar11 = 0x7fffffff;
          pCVar8 = (CapTableReader *)0x0;
          local_1b8.data = (WirePointer *)0x0;
          pSVar15 = (SegmentReader *)0x0;
        }
        else {
          local_1b8.data = pWVar3 + 2;
        }
        local_1b8.segment = pSVar15;
        local_1b8.capTable = pCVar8;
        local_1b8.pointers._0_4_ = iVar11;
        capnp::_::PointerReader::getStruct(&local_200,(PointerReader *)&local_1b8,(word *)0x0);
        if ((replacement->_reader).dataSize < 0xc0) {
          uVar14 = 0;
        }
        else {
          uVar14 = *(uint64_t *)((long)(replacement->_reader).data + 0x10);
        }
        local_68.ptr.isSet = true;
        local_68.ptr.field_1.value._reader.segment = (this->existingNode)._reader.segment;
        local_68.ptr.field_1.value._reader.capTable = (this->existingNode)._reader.capTable;
        local_68.ptr.field_1.value._reader.data = (this->existingNode)._reader.data;
        local_68.ptr.field_1.value._reader.pointers = (this->existingNode)._reader.pointers;
        local_68.ptr.field_1._32_4_ = (this->existingNode)._reader.dataSize;
        local_68.ptr.field_1._36_2_ = (this->existingNode)._reader.pointerCount;
        local_68.ptr.field_1._38_2_ = *(undefined2 *)&(this->existingNode)._reader.field_0x26;
        local_68.ptr.field_1._40_8_ = *(undefined8 *)&(this->existingNode)._reader.nestingLimit;
        local_a0.ptr.isSet = true;
        local_a0.ptr.field_1.value._reader.segment = (field->_reader).segment;
        local_a0.ptr.field_1.value._reader.capTable = (field->_reader).capTable;
        local_a0.ptr.field_1.value._reader.data = (field->_reader).data;
        local_a0.ptr.field_1.value._reader.pointers = (field->_reader).pointers;
        local_a0.ptr.field_1._32_4_ = (field->_reader).dataSize;
        local_a0.ptr.field_1._36_2_ = (field->_reader).pointerCount;
        local_a0.ptr.field_1._38_2_ = *(undefined2 *)&(field->_reader).field_0x26;
        local_a0.ptr.field_1._40_8_ = *(undefined8 *)&(field->_reader).nestingLimit;
        checkUpgradeToStruct(this,(Reader *)&local_200,uVar14,&local_68,&local_a0);
      }
      else if (sVar6 == 0) {
        if (uVar10 < 3) {
          local_1b8.pointers._0_4_ = 0x7fffffff;
          local_1b8.capTable = (CapTableReader *)0x0;
          local_1b8.data = (WirePointer *)0x0;
          local_1b8.segment = (SegmentReader *)0x0;
        }
        else {
          local_1b8.data = pWVar3 + 2;
          local_1b8.capTable = pCVar8;
          local_1b8.segment = pSVar15;
          local_1b8.pointers._0_4_ = iVar11;
        }
        local_1d0 = (field->_reader).data;
        pSVar13 = (replacement->_reader).segment;
        pCVar9 = (replacement->_reader).capTable;
        local_1c8 = (replacement->_reader).data;
        pWVar4 = (replacement->_reader).pointers;
        uVar5 = (replacement->_reader).pointerCount;
        iVar16 = (replacement->_reader).nestingLimit;
        local_1c0 = pCVar8;
        capnp::_::PointerReader::getStruct(&local_200,(PointerReader *)&local_1b8,(word *)0x0);
        if (uVar5 < 3) {
          local_180.nestingLimit = 0x7fffffff;
          local_180.capTable = (CapTableReader *)0x0;
          local_180.pointer = (WirePointer *)0x0;
          local_180.segment = (SegmentReader *)0x0;
        }
        else {
          local_180.pointer = pWVar4 + 2;
          local_180.capTable = pCVar9;
          local_180.segment = pSVar13;
          local_180.nestingLimit = iVar16;
        }
        capnp::_::PointerReader::getStruct(&local_1b8,&local_180,(word *)0x0);
        checkCompatibility(this,(Reader *)&local_200,(Reader *)&local_1b8,NO_UPGRADE_TO_STRUCT);
        if (uVar10 < 4) {
          iVar11 = 0x7fffffff;
          local_1b8.capTable = (CapTableReader *)0x0;
          local_1b8.data = (WirePointer *)0x0;
          pSVar15 = (SegmentReader *)0x0;
        }
        else {
          local_1b8.data = pWVar3 + 3;
          local_1b8.capTable = local_1c0;
        }
        local_1b8.segment = pSVar15;
        local_1b8.pointers._0_4_ = iVar11;
        capnp::_::PointerReader::getStruct(&local_200,(PointerReader *)&local_1b8,(word *)0x0);
        if (uVar5 < 4) {
          iVar16 = 0x7fffffff;
          pCVar9 = (CapTableReader *)0x0;
          local_180.pointer = (WirePointer *)0x0;
          pSVar13 = (SegmentReader *)0x0;
        }
        else {
          local_180.pointer = pWVar4 + 3;
        }
        local_180.segment = pSVar13;
        local_180.capTable = pCVar9;
        local_180.nestingLimit = iVar16;
        capnp::_::PointerReader::getStruct(&local_1b8,&local_180,(word *)0x0);
        checkDefaultCompatibility(this,(Reader *)&local_200,(Reader *)&local_1b8);
        iVar16 = 0;
        iVar11 = 0;
        if (0x3f < uVar1) {
          iVar11 = *(int *)((long)local_1d0 + 4);
        }
        if (0x3f < uVar2) {
          iVar16 = *(int *)((long)local_1c8 + 4);
        }
        if (iVar11 != iVar16) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                    ((Fault *)&local_200,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x335,FAILED,"slot.getOffset() == replacementSlot.getOffset()",
                     "\"field position changed\"",(char (*) [23])"field position changed");
          this->compatibility = INCOMPATIBLE;
          kj::_::Debug::Fault::~Fault((Fault *)&local_200);
        }
      }
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
              ((Fault *)&local_200,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x325,FAILED,"discriminant == replacementDiscriminant",
               "\"Field discriminant changed.\"",(char (*) [28])"Field discriminant changed.");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault((Fault *)&local_200);
  }
  kj::_::Debug::Context::~Context(&local_160);
  return;
}

Assistant:

void checkCompatibility(const schema::Field::Reader& field,
                          const schema::Field::Reader& replacement) {
    KJ_CONTEXT("comparing struct field", field.getName());

    // A field that is initially not in a union can be upgraded to be in one, as long as it has
    // discriminant 0.
    uint discriminant = hasDiscriminantValue(field) ? field.getDiscriminantValue() : 0;
    uint replacementDiscriminant =
        hasDiscriminantValue(replacement) ? replacement.getDiscriminantValue() : 0;
    VALIDATE_SCHEMA(discriminant == replacementDiscriminant, "Field discriminant changed.");

    switch (field.which()) {
      case schema::Field::SLOT: {
        auto slot = field.getSlot();

        switch (replacement.which()) {
          case schema::Field::SLOT: {
            auto replacementSlot = replacement.getSlot();

            checkCompatibility(slot.getType(), replacementSlot.getType(),
                               NO_UPGRADE_TO_STRUCT);
            checkDefaultCompatibility(slot.getDefaultValue(),
                                      replacementSlot.getDefaultValue());

            VALIDATE_SCHEMA(slot.getOffset() == replacementSlot.getOffset(),
                            "field position changed");
            break;
          }
          case schema::Field::GROUP:
            checkUpgradeToStruct(slot.getType(), replacement.getGroup().getTypeId(),
                                 existingNode, field);
            break;
        }

        break;
      }

      case schema::Field::GROUP:
        switch (replacement.which()) {
          case schema::Field::SLOT:
            checkUpgradeToStruct(replacement.getSlot().getType(), field.getGroup().getTypeId(),
                                 replacementNode, replacement);
            break;
          case schema::Field::GROUP:
            VALIDATE_SCHEMA(field.getGroup().getTypeId() == replacement.getGroup().getTypeId(),
                            "group id changed");
            break;
        }
        break;
    }
  }